

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteFuncDeclaration
          (CWriter *this,FuncDeclaration *decl,string *name)

{
  string_view local_50;
  string local_40;
  string *local_20;
  string *name_local;
  FuncDeclaration *decl_local;
  CWriter *this_local;
  
  local_20 = name;
  name_local = (string *)decl;
  decl_local = (FuncDeclaration *)this;
  (anonymous_namespace)::CWriter::
  Write<std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,&(decl->sig).result_types,(char (*) [2])0x234f67,name,
             (char (*) [2])0x239ca8);
  (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_(&local_40,(CWriter *)this);
  (anonymous_namespace)::CWriter::Write<std::__cxx11::string,char_const(&)[2]>
            ((CWriter *)this,&local_40,(char (*) [2])0x23cdd2);
  std::__cxx11::string::~string((string *)&local_40);
  WriteParamTypes(this,(FuncDeclaration *)name_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,")");
  Write(this,local_50);
  return;
}

Assistant:

void CWriter::WriteFuncDeclaration(const FuncDeclaration& decl,
                                   const std::string& name) {
  Write(decl.sig.result_types, " ", name, "(");
  Write(ModuleInstanceTypeName(), "*");
  WriteParamTypes(decl);
  Write(")");
}